

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

void __thiscall
EnvironmentNAVXYTHETALATTICE::ComputeReplanningDataforAction
          (EnvironmentNAVXYTHETALATTICE *this,EnvNAVXYTHETALATAction_t *action)

{
  sbpl_xy_theta_cell_t cell;
  sbpl_xy_theta_cell_t cell_00;
  sbpl_xy_theta_cell_t cell_01;
  sbpl_xy_theta_cell_t cell_02;
  sbpl_xy_theta_cell_t cell_03;
  sbpl_xy_theta_cell_t cell_04;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RSI;
  long *in_RDI;
  int i;
  sbpl_xy_theta_cell_t endcell3d;
  sbpl_xy_theta_cell_t startcell3d;
  int j;
  size_type in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int iVar5;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  int iVar6;
  undefined4 in_stack_fffffffffffffeec;
  int iVar7;
  int in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int iVar8;
  int local_fc;
  int local_e8;
  int local_30;
  sbpl_xy_theta_cell_t local_2c;
  sbpl_xy_theta_cell_t local_20;
  int local_14;
  long local_10;
  
  local_10 = in_RSI;
  sbpl_xy_theta_cell_t::sbpl_xy_theta_cell_t(&local_20);
  sbpl_xy_theta_cell_t::sbpl_xy_theta_cell_t(&local_2c);
  for (local_30 = 0;
      sVar2 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::size
                        ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)(local_10 + 0x10))
      , local_30 < (int)sVar2; local_30 = local_30 + 1) {
    local_20.theta = (int)*(char *)(local_10 + 1);
    pvVar3 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at
                       ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8);
    local_20.x = -pvVar3->x;
    pvVar3 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at
                       ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8);
    local_20.y = -pvVar3->y;
    if ((*(byte *)((long)in_RDI + 0x17c) & 1) == 0) {
      if (*(char *)(local_10 + 4) < '\0') {
        local_e8 = ((int)*(char *)(local_10 + 4) % (int)in_RDI[6] + (int)in_RDI[6]) % (int)in_RDI[6]
        ;
      }
      else {
        local_e8 = (int)*(char *)(local_10 + 4) % (int)in_RDI[6];
      }
      local_2c.theta = local_e8;
    }
    else {
      local_2c.theta = (**(code **)(*in_RDI + 0x120))(in_RDI,(int)*(char *)(local_10 + 4));
    }
    local_2c.x = local_20.x + *(char *)(local_10 + 2);
    local_2c.y = local_20.y + *(char *)(local_10 + 3);
    for (local_14 = 0; iVar8 = local_14,
        sVar2 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                          ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                           (in_RDI + 0x28)), iVar8 < (int)sVar2; local_14 = local_14 + 1) {
      pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                         ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffed8);
      cell_04.y = local_2c.y;
      cell_04.x = local_2c.x;
      cell_04.theta = local_2c.theta;
      bVar1 = sbpl_xy_theta_cell_t::operator==(pvVar4,cell_04);
      if (bVar1) break;
    }
    iVar8 = local_14;
    sVar2 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                      ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                       (in_RDI + 0x28));
    if (iVar8 == (int)sVar2) {
      std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::push_back
                ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
    for (local_14 = 0; iVar8 = local_14,
        sVar2 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                          ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                           (in_RDI + 0x2b)), iVar8 < (int)sVar2; local_14 = local_14 + 1) {
      pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                         ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                          CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffed8);
      cell_03.y = local_20.y;
      cell_03.x = local_20.x;
      cell_03.theta = local_20.theta;
      bVar1 = sbpl_xy_theta_cell_t::operator==(pvVar4,cell_03);
      if (bVar1) break;
    }
    iVar8 = local_14;
    sVar2 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                      ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                       (in_RDI + 0x2b));
    if (iVar8 == (int)sVar2) {
      std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::push_back
                ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
  }
  local_20.theta = (int)*(char *)(local_10 + 1);
  local_20.x = 0;
  local_20.y = 0;
  if ((*(byte *)((long)in_RDI + 0x17c) & 1) == 0) {
    if (*(char *)(local_10 + 4) < '\0') {
      local_fc = ((int)*(char *)(local_10 + 4) % (int)in_RDI[6] + (int)in_RDI[6]) % (int)in_RDI[6];
    }
    else {
      local_fc = (int)*(char *)(local_10 + 4) % (int)in_RDI[6];
    }
    local_2c.theta = local_fc;
  }
  else {
    local_2c.theta = (**(code **)(*in_RDI + 0x120))(in_RDI,(int)*(char *)(local_10 + 4));
  }
  local_2c.x = local_20.x + *(char *)(local_10 + 2);
  local_2c.y = local_20.y + *(char *)(local_10 + 3);
  for (local_14 = 0; iVar8 = local_14,
      sVar2 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                        ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                         (in_RDI + 0x28)), iVar8 < (int)sVar2; local_14 = local_14 + 1) {
    pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                       ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8);
    cell_02.y = local_2c.y;
    cell_02.x = local_2c.x;
    cell_02.theta = local_2c.theta;
    bVar1 = sbpl_xy_theta_cell_t::operator==(pvVar4,cell_02);
    if (bVar1) break;
  }
  iVar8 = local_14;
  sVar2 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                    ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                     (in_RDI + 0x28));
  if (iVar8 == (int)sVar2) {
    std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::push_back
              ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  for (local_14 = 0; iVar8 = local_14,
      sVar2 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                        ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                         (in_RDI + 0x2b)), iVar8 < (int)sVar2; local_14 = local_14 + 1) {
    pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                       ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8);
    cell_01.y = local_20.y;
    cell_01.x = local_20.x;
    cell_01.theta = local_20.theta;
    bVar1 = sbpl_xy_theta_cell_t::operator==(pvVar4,cell_01);
    if (bVar1) break;
  }
  iVar8 = local_14;
  sVar2 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                    ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                     (in_RDI + 0x2b));
  if (iVar8 == (int)sVar2) {
    std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::push_back
              ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
               CONCAT44(iVar8,in_stack_fffffffffffffef0),
               (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  local_20.theta = (int)*(char *)(local_10 + 1);
  local_20.x = -(int)*(char *)(local_10 + 2);
  local_20.y = -(int)*(char *)(local_10 + 3);
  if ((*(byte *)((long)in_RDI + 0x17c) & 1) == 0) {
    if (*(char *)(local_10 + 4) < '\0') {
      in_stack_fffffffffffffef0 =
           ((int)*(char *)(local_10 + 4) % (int)in_RDI[6] + (int)in_RDI[6]) % (int)in_RDI[6];
      local_2c.theta = in_stack_fffffffffffffef0;
    }
    else {
      in_stack_fffffffffffffef0 = (int)*(char *)(local_10 + 4) % (int)in_RDI[6];
      local_2c.theta = in_stack_fffffffffffffef0;
    }
  }
  else {
    local_2c.theta = (**(code **)(*in_RDI + 0x120))(in_RDI,(int)*(char *)(local_10 + 4));
  }
  local_2c.x = local_20.x + *(char *)(local_10 + 2);
  local_2c.y = local_20.y + *(char *)(local_10 + 3);
  local_14 = 0;
  while (iVar7 = local_14,
        sVar2 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                          ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                           (in_RDI + 0x28)), iVar7 < (int)sVar2) {
    pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                       ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                        CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        in_stack_fffffffffffffed8);
    cell_00.y = local_2c.y;
    cell_00.x = local_2c.x;
    cell_00.theta = local_2c.theta;
    bVar1 = sbpl_xy_theta_cell_t::operator==(pvVar4,cell_00);
    if (bVar1) break;
    local_14 = local_14 + 1;
  }
  iVar6 = local_14;
  sVar2 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                    ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                     (in_RDI + 0x28));
  if (iVar6 == (int)sVar2) {
    std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::push_back
              ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
               CONCAT44(iVar8,in_stack_fffffffffffffef0),(value_type *)CONCAT44(iVar7,iVar6));
  }
  local_14 = 0;
  while (iVar5 = local_14,
        sVar2 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                          ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                           (in_RDI + 0x2b)), iVar5 < (int)sVar2) {
    pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                       ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                        CONCAT44(iVar5,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8);
    cell.y = local_20.y;
    cell.x = local_20.x;
    cell.theta = local_20.theta;
    bVar1 = sbpl_xy_theta_cell_t::operator==(pvVar4,cell);
    if (bVar1) break;
    local_14 = local_14 + 1;
  }
  iVar5 = local_14;
  sVar2 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::size
                    ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
                     (in_RDI + 0x2b));
  if (iVar5 == (int)sVar2) {
    std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::push_back
              ((vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *)
               CONCAT44(iVar8,in_stack_fffffffffffffef0),(value_type *)CONCAT44(iVar7,iVar6));
  }
  return;
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::ComputeReplanningDataforAction(
    EnvNAVXYTHETALATAction_t* action)
{
    int j;

    // iterate over all the cells involved in the action
    sbpl_xy_theta_cell_t startcell3d, endcell3d;
    for (int i = 0; i < (int)action->intersectingcellsV.size(); i++) {
        // compute the translated affected search Pose - what state has an
        // outgoing action whose intersecting cell is at 0,0
        startcell3d.theta = action->starttheta;
        startcell3d.x = -action->intersectingcellsV.at(i).x;
        startcell3d.y = -action->intersectingcellsV.at(i).y;

        // compute the translated affected search Pose - what state has an
        // incoming action whose intersecting cell is at 0,0
        if (bUseNonUniformAngles) {
            endcell3d.theta = normalizeDiscAngle(action->endtheta);
        }
        else {
            endcell3d.theta = NORMALIZEDISCTHETA(action->endtheta, EnvNAVXYTHETALATCfg.NumThetaDirs);
        }
        endcell3d.x = startcell3d.x + action->dX;
        endcell3d.y = startcell3d.y + action->dY;

        //store the cells if not already there
        for (j = 0; j < (int)affectedsuccstatesV.size(); j++) {
            if (affectedsuccstatesV.at(j) == endcell3d) {
                break;
            }
        }
        if (j == (int)affectedsuccstatesV.size()) {
            affectedsuccstatesV.push_back(endcell3d);
        }

        for (j = 0; j < (int)affectedpredstatesV.size(); j++) {
            if (affectedpredstatesV.at(j) == startcell3d) {
                break;
            }
        }
        if (j == (int)affectedpredstatesV.size()) {
            affectedpredstatesV.push_back(startcell3d);
        }
    } // over intersecting cells

    // add the centers since with h2d we are using these in cost computations
    // ---intersecting cell = origin
    // compute the translated affected search Pose - what state has an outgoing
    // action whose intersecting cell is at 0,0
    startcell3d.theta = action->starttheta;
    startcell3d.x = -0;
    startcell3d.y = -0;

    // compute the translated affected search Pose - what state has an incoming
    // action whose intersecting cell is at 0,0
    if (bUseNonUniformAngles) {
        endcell3d.theta = normalizeDiscAngle(action->endtheta);
    }
    else {
        endcell3d.theta = NORMALIZEDISCTHETA(action->endtheta, EnvNAVXYTHETALATCfg.NumThetaDirs);
    }
    endcell3d.x = startcell3d.x + action->dX;
    endcell3d.y = startcell3d.y + action->dY;

    //store the cells if not already there
    for (j = 0; j < (int)affectedsuccstatesV.size(); j++) {
        if (affectedsuccstatesV.at(j) == endcell3d) {
            break;
        }
    }
    if (j == (int)affectedsuccstatesV.size()) {
        affectedsuccstatesV.push_back(endcell3d);
    }

    for (j = 0; j < (int)affectedpredstatesV.size(); j++) {
        if (affectedpredstatesV.at(j) == startcell3d) {
            break;
        }
    }
    if (j == (int)affectedpredstatesV.size()) {
        affectedpredstatesV.push_back(startcell3d);
    }

    //---intersecting cell = outcome state
    // compute the translated affected search Pose - what state has an outgoing
    // action whose intersecting cell is at 0,0
    startcell3d.theta = action->starttheta;
    startcell3d.x = -action->dX;
    startcell3d.y = -action->dY;

    // compute the translated affected search Pose - what state has an incoming
    // action whose intersecting cell is at 0,0
    if (bUseNonUniformAngles) {
        endcell3d.theta = normalizeDiscAngle(action->endtheta);
    }
    else {
        endcell3d.theta = NORMALIZEDISCTHETA(action->endtheta, EnvNAVXYTHETALATCfg.NumThetaDirs);
    }
    endcell3d.x = startcell3d.x + action->dX;
    endcell3d.y = startcell3d.y + action->dY;

    for (j = 0; j < (int)affectedsuccstatesV.size(); j++) {
        if (affectedsuccstatesV.at(j) == endcell3d) {
            break;
        }
    }
    if (j == (int)affectedsuccstatesV.size()) {
        affectedsuccstatesV.push_back(endcell3d);
    }

    for (j = 0; j < (int)affectedpredstatesV.size(); j++) {
        if (affectedpredstatesV.at(j) == startcell3d) {
            break;
        }
    }
    if (j == (int)affectedpredstatesV.size()) {
        affectedpredstatesV.push_back(startcell3d);
    }
}